

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolOccurrenceReplacement.cpp
# Opt level: O0

Term * __thiscall SymbolOccurrenceReplacement::process(SymbolOccurrenceReplacement *this,Term *term)

{
  bool bVar1;
  SpecialFunctor SVar2;
  uint uVar3;
  Term *pTVar4;
  TermList __addr;
  byte *pbVar5;
  Term *in_RSI;
  byte *in_RDI;
  uint var;
  Iterator fvit;
  Substitution substitution;
  TermStack arguments;
  TermList *arg;
  bool renaming;
  uint i;
  DArray<Kernel::TermList> terms;
  SpecialTermData *sd;
  Stack<Kernel::TermList> *in_stack_fffffffffffffd48;
  TermList in_stack_fffffffffffffd50;
  TermList in_stack_fffffffffffffd58;
  Stack<Kernel::TermList> *in_stack_fffffffffffffd60;
  bool local_249;
  Iterator local_178;
  Substitution local_170;
  Stack<Kernel::TermList> local_148;
  TermList *local_128;
  bool local_119;
  SpecialTermData *local_20;
  Term *local_18;
  Term *local_8;
  
  local_18 = in_RSI;
  bVar1 = Kernel::Term::isSpecial((Term *)0xd09224);
  if (bVar1) {
    local_20 = Kernel::Term::getSpecialData(local_18);
    SVar2 = Kernel::Term::specialFunctor((Term *)0xd0924f);
    pTVar4 = (Term *)(*(code *)(&DAT_00f1ca60 + *(int *)(&DAT_00f1ca60 + (ulong)SVar2 * 4)))();
    return pTVar4;
  }
  local_249 = false;
  if ((*in_RDI & 1) == 0) {
    uVar3 = Kernel::Term::functor(local_18);
    local_249 = uVar3 == *(uint *)(in_RDI + 0x10);
  }
  local_119 = local_249;
  pbVar5 = in_RDI;
  local_128 = Kernel::Term::args(local_18);
  Lib::Stack<Kernel::TermList>::Stack(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58._content);
  Kernel::Substitution::Substitution((Substitution *)0xd09995);
  if ((local_119 & 1U) == 0) {
    while (bVar1 = Kernel::TermList::isEmpty((TermList *)0xd09adb), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = Kernel::TermList::isVar((TermList *)in_stack_fffffffffffffd50._content);
      if (bVar1) {
LAB_00d09b3b:
        Lib::Stack<Kernel::TermList>::push(in_stack_fffffffffffffd48,in_stack_fffffffffffffd50);
      }
      else {
        Kernel::TermList::term((TermList *)0xd09b1a);
        bVar1 = Kernel::Term::isSort((Term *)0xd09b2b);
        if (bVar1) goto LAB_00d09b3b;
        process((SymbolOccurrenceReplacement *)in_stack_fffffffffffffd50._content,
                in_stack_fffffffffffffd58);
        Lib::Stack<Kernel::TermList>::push(in_stack_fffffffffffffd48,in_stack_fffffffffffffd50);
      }
      local_128 = Kernel::TermList::next(local_128);
    }
  }
  else {
    Lib::List<unsigned_int>::Iterator::Iterator(&local_178,*(List<unsigned_int> **)(in_RDI + 0x18));
    while (bVar1 = Lib::List<unsigned_int>::Iterator::hasNext((Iterator *)0xd099cf), bVar1) {
      uVar3 = Lib::List<unsigned_int>::Iterator::next
                        ((Iterator *)in_stack_fffffffffffffd50._content);
      __addr = process(in_stack_fffffffffffffd50._content,in_stack_fffffffffffffd58);
      Kernel::Substitution::bind(&local_170,uVar3,(sockaddr *)__addr._content,(socklen_t)pbVar5);
      local_128 = Kernel::TermList::next(local_128);
    }
  }
  if ((local_119 & 1U) == 0) {
    Lib::Stack<Kernel::TermList>::begin(&local_148);
    in_stack_fffffffffffffd50._content =
         (uint64_t)
         Kernel::Term::create
                   (in_stack_fffffffffffffd50._content,(TermList *)in_stack_fffffffffffffd48);
    local_8 = (Term *)in_stack_fffffffffffffd50._content;
  }
  else {
    local_8 = Kernel::SubstHelper::apply<Kernel::Substitution>
                        ((Term *)in_stack_fffffffffffffd50._content,
                         (Substitution *)in_stack_fffffffffffffd48,false);
  }
  Kernel::Substitution::~Substitution((Substitution *)0xd09c86);
  Lib::Stack<Kernel::TermList>::~Stack
            ((Stack<Kernel::TermList> *)in_stack_fffffffffffffd50._content);
  return local_8;
}

Assistant:

Term* SymbolOccurrenceReplacement::process(Term* term) {
  ASS(!term->isSort());

  if (term->isSpecial()) {
    Term::SpecialTermData* sd = term->getSpecialData();
    switch (term->specialFunctor()) {
      case SpecialFunctor::ITE:
        return Term::createITE(process(sd->getCondition()), process(*term->nthArgument(0)), process(*term->nthArgument(1)), sd->getSort());

      case SpecialFunctor::LET:
          if (_isPredicate == (sd->getBinding().isTerm() && sd->getBinding().term()->isBoolean())) {
            // function symbols, defined inside $let are expected to be
            // disjoint and fresh symbols are expected to be fresh
            ASS_NEQ(sd->getFunctor(), _symbol);
            //ASS_NEQ(sd->getFunctor(), _freshSymbol);
          }
          return Term::createLet(sd->getFunctor(), sd->getVariables(), process(sd->getBinding()), process(*term->nthArgument(0)), sd->getSort());

      case SpecialFunctor::FORMULA:
          return Term::createFormula(process(sd->getFormula()));

      case SpecialFunctor::LET_TUPLE:
        if (_isPredicate == (sd->getBinding().isTerm() && sd->getBinding().term()->isBoolean())) {
          // function symbols, defined inside $let are expected to be
          // disjoint and fresh symbols are expected to be fresh
          ASS_NEQ(sd->getFunctor(), _symbol);
          //ASS_NEQ(sd->getFunctor(), _freshSymbol);
        }
        return Term::createTupleLet(sd->getFunctor(), sd->getTupleSymbols(), process(sd->getBinding()), process(*term->nthArgument(0)), sd->getSort());

      case SpecialFunctor::TUPLE:
        return Term::createTuple(process(TermList(sd->getTupleTerm())).term());

      case SpecialFunctor::LAMBDA:
        NOT_IMPLEMENTED;
      case SpecialFunctor::MATCH: {
        DArray<TermList> terms(term->arity());
        for (unsigned i = 0; i < term->arity(); i++) {
          terms[i] = process(*term->nthArgument(i));
        }
        return Term::createMatch(sd->getSort(), sd->getMatchedSort(), term->arity(), terms.begin());
      }
    }
    ASSERTION_VIOLATION;
  }

  bool renaming = !_isPredicate && (term->functor() == _symbol);

  TermList* arg = term->args();
  TermStack arguments;
  Substitution substitution;

  if (renaming) {
    VList::Iterator fvit(_argVars);
    while (fvit.hasNext()) {
      unsigned var = fvit.next();
      substitution.bind(var, process(*arg));
      arg = arg->next();
    }
  } else {
    while (!arg->isEmpty()) {
      if(arg->isVar() || arg->term()->isSort()){
        arguments.push(*arg);
      } else {
        arguments.push(process(*arg));        
      }
      arg = arg->next();
    }  
  }

  if (renaming) {
    return SubstHelper::apply(_freshApplication, substitution);
  } else {
    return Term::create(term, arguments.begin());
  }
}